

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O2

uint16_t ot::commissioner::GetSockPort(sockaddr_storage *aSockAddr)

{
  if ((aSockAddr->ss_family | 8) == 10) {
    return *(ushort *)aSockAddr->__ss_padding << 8 | *(ushort *)aSockAddr->__ss_padding >> 8;
  }
  abort();
}

Assistant:

static uint16_t GetSockPort(const sockaddr_storage &aSockAddr)
{
    uint16_t port;

    if (aSockAddr.ss_family == AF_INET)
    {
        auto &addr4 = *reinterpret_cast<const sockaddr_in *>(&aSockAddr);
        ExitNow(port = ntohs(addr4.sin_port));
    }
    else if (aSockAddr.ss_family == AF_INET6)
    {
        auto &addr6 = *reinterpret_cast<const sockaddr_in6 *>(&aSockAddr);
        ExitNow(port = ntohs(addr6.sin6_port));
    }
    else
    {
        VerifyOrDie(false);
    }

exit:
    return port;
}